

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ler.c
# Opt level: O3

int errfmt(char *outbuf,int outbufl,char *fmt,int argc,erradef *argv)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  char *__format;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char buf [20];
  char *local_70;
  char *local_60;
  char local_48 [24];
  
  uVar3 = (ulong)(uint)outbufl;
  cVar1 = *fmt;
  iVar8 = 0;
  local_70 = outbuf;
  if (1 < outbufl && cVar1 != '\0') {
    iVar6 = 0;
    iVar8 = 0;
    do {
      if (cVar1 == '%') {
        pcVar4 = fmt + 1;
        cVar1 = fmt[1];
        if (argc <= iVar6) {
          cVar1 = '\x01';
        }
        if (cVar1 < 'd') {
          if (cVar1 != '\0') {
            if (cVar1 == '%') {
              iVar6 = iVar6 + 1;
              local_60 = "%";
              iVar7 = 1;
              goto LAB_00213f6c;
            }
LAB_002140d3:
            iVar6 = iVar6 + -1;
            local_60 = "";
            fmt = pcVar4;
          }
          iVar6 = iVar6 + 1;
          pcVar4 = fmt;
        }
        else {
          if (cVar1 == 'd') {
            uVar5 = argv[iVar6].erraint;
            __format = "%d";
LAB_00214095:
            local_60 = local_48;
            sprintf(local_48,__format,(ulong)uVar5);
          }
          else {
            if (cVar1 != 's') {
              if (cVar1 != 'u') goto LAB_002140d3;
              uVar5 = argv[iVar6].erraint;
              __format = "%u";
              goto LAB_00214095;
            }
            local_60 = argv[iVar6].errastr;
          }
          sVar2 = strlen(local_60);
          iVar7 = (int)sVar2;
          iVar6 = iVar6 + 1;
          if (iVar7 != 0) goto LAB_00213f6c;
        }
      }
      else {
        pcVar4 = fmt;
        if (cVar1 == '\\') {
          cVar1 = fmt[1];
          if (cVar1 != '\0') {
            fmt = fmt + 1;
            if (cVar1 == '\t') {
              pcVar4 = "\t";
            }
            else {
              pcVar4 = fmt;
              if (cVar1 == '\n') {
                pcVar4 = "\n";
              }
            }
            goto LAB_00213f63;
          }
          iVar7 = 1;
          pcVar4 = fmt;
        }
        else {
LAB_00213f63:
          local_60 = pcVar4;
          iVar7 = 1;
          pcVar4 = fmt;
        }
LAB_00213f6c:
        uVar5 = (int)uVar3 - iVar7;
        if ((int)uVar3 < iVar7) {
          memcpy(local_70,local_60,uVar3 - 1);
          uVar5 = 1;
        }
        else {
          memcpy(local_70,local_60,(long)iVar7);
          local_70 = local_70 + iVar7;
        }
        iVar8 = iVar7 + iVar8;
        uVar3 = (ulong)uVar5;
      }
      outbufl = (int)uVar3;
      cVar1 = pcVar4[1];
    } while ((cVar1 != '\0') && (fmt = pcVar4 + 1, 1 < outbufl));
  }
  if (outbufl != 0) {
    *local_70 = '\0';
  }
  return iVar8;
}

Assistant:

int errfmt(char *outbuf, int outbufl, char *fmt, int argc, erradef *argv)
{
    int    outlen = 0;
    int    argi   = 0;
    int    len;
    char   buf[20];
    char  *p;
    char   fmtchar;

    while (*fmt != '\0' && outbufl > 1)
    {
        switch(*fmt)
        {
        case '\\':
            ++fmt;
            len = 1;
            switch(*fmt)
            {
            case '\0':
                --fmt;
                break;
            case '\n':
                p = "\n";
                break;
            case '\t':
                p = "\t";
                break;
            default:
                p = fmt;
                break;
            }
            break;
            
        case '%':
            ++fmt;
            fmtchar = *fmt;
            if (argi >= argc) fmtchar = 1;          /* too many - ignore it */
            switch(fmtchar)
            {
            case '\0':
                --fmt;
                len = 0;
                break;
                
            case '%':
                p = "%";
                len = 1;
                break;
                
            case 'd':
                sprintf(buf, "%d", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 'u':
                sprintf(buf, "%u", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 's':
                p = argv[argi].errastr;
                len = strlen(p);
                break;
                
            default:
                p = "";
                len = 0;
                --argi;
                break;
            }
            ++argi;
            break;
            
        default:
            p = fmt;
            len = 1;
            break;
        }

        /* copy output that was set up above */
        if (len != 0)
        {
            if (outbufl >= len)
            {
                memcpy(outbuf, p, (size_t)len);
                outbufl -= len;
                outbuf += len;
            }
            else if (outbufl > 1)
            {
                memcpy(outbuf, p, (size_t)outbufl - 1);
                outbufl = 1;
            }
            outlen += len;
        }
        ++fmt;
    }

    /* add a null terminator */
    if (outbufl != 0)
        *outbuf++ = '\0';

    /* return the length */
    return outlen;
}